

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator.c
# Opt level: O2

memory_allocator memory_allocator_create(memory_allocator_iface iface,void *ctx)

{
  memory_allocator_impl pvVar1;
  memory_allocator pmVar2;
  
  pvVar1 = (*iface->create)(ctx);
  if (pvVar1 != (memory_allocator_impl)0x0) {
    pmVar2 = (memory_allocator)(*iface->allocate)(pvVar1,0x38);
    if (pmVar2 != (memory_allocator)0x0) {
      pmVar2->iface = iface;
      pmVar2->impl = pvVar1;
      (pmVar2->size).alloc = 0;
      (pmVar2->size).bad_alloc = 0;
      (pmVar2->size).realloc = 0;
      (pmVar2->size).bad_realloc = 0;
      (pmVar2->size).dealloc = 0;
      return pmVar2;
    }
    (*iface->destroy)(pvVar1);
  }
  return (memory_allocator)0x0;
}

Assistant:

memory_allocator memory_allocator_create(memory_allocator_iface iface, void *ctx)
{
	memory_allocator allocator;

	memory_allocator_impl impl = iface->create(ctx);

	if (impl == NULL)
	{
		return NULL;
	}

	allocator = iface->allocate(impl, sizeof(struct memory_allocator_type));

	if (allocator == NULL)
	{
		iface->destroy(impl);

		return NULL;
	}

	allocator->iface = iface;
	allocator->impl = impl;

	allocator->size.alloc = 0;
	allocator->size.bad_alloc = 0;
	allocator->size.realloc = 0;
	allocator->size.bad_realloc = 0;
	allocator->size.dealloc = 0;

	return allocator;
}